

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O2

void __thiscall
vectorgraphics::Style::Style
          (Style *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *style_map,ConditionPtr *condition_ptr)

{
  std::__shared_ptr<vectorgraphics::Condition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<vectorgraphics::Condition,_(__gnu_cxx::_Lock_policy)2> *)this,
             &condition_ptr->
              super___shared_ptr<vectorgraphics::Condition,_(__gnu_cxx::_Lock_policy)2>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->style_map_)._M_t,&style_map->_M_t);
  return;
}

Assistant:

Style::Style(const std::map<std::string, std::string>& style_map, ConditionPtr condition_ptr) :
    style_map_(style_map),
    condition_ptr_(condition_ptr) {
  }